

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O2

TValue * cpparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  TValue *pTVar1;
  int __c;
  int iVar2;
  char *pcVar3;
  GCproto *pt;
  GCfunc *pGVar4;
  GCstr *pGVar5;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  iVar2 = lj_lex_setup(L,(LexState *)ud);
  if (*(char **)((long)ud + 0x78) != (char *)0x0) {
    __c = 0x62;
    if (iVar2 == 0) {
      __c = 0x74;
    }
    pcVar3 = strchr(*(char **)((long)ud + 0x78),__c);
    if (pcVar3 == (char *)0x0) {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pGVar5 = lj_err_str(L,LJ_ERR_XMODE);
      (pTVar1->u32).lo = (uint32_t)pGVar5;
      (pTVar1->field_2).it = 0xfffffffb;
      lj_err_throw(L,3);
    }
  }
  if (iVar2 == 0) {
    pt = lj_parse((LexState *)ud);
  }
  else {
    pt = lj_bcread((LexState *)ud);
  }
  pGVar4 = lj_func_newL_empty(L,pt,(GCtab *)(ulong)(L->env).gcptr32);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  (pTVar1->u32).lo = (uint32_t)pGVar4;
  (pTVar1->field_2).it = 0xfffffff7;
  return (TValue *)0x0;
}

Assistant:

static TValue *cpparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  LexState *ls = (LexState *)ud;
  GCproto *pt;
  GCfunc *fn;
  int bc;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  bc = lj_lex_setup(L, ls);
  if (ls->mode && !strchr(ls->mode, bc ? 'b' : 't')) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_XMODE));
    lj_err_throw(L, LUA_ERRSYNTAX);
  }
  pt = bc ? lj_bcread(ls) : lj_parse(ls);
  fn = lj_func_newL_empty(L, pt, tabref(L->env));
  /* Don't combine above/below into one statement. */
  setfuncV(L, L->top++, fn);
  return NULL;
}